

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  short sVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar16 = j->code_buffer;
  uVar6 = (ulong)hdc->fast[uVar16 >> 0x17];
  if (uVar6 == 0xff) {
    lVar15 = 0;
    do {
      lVar14 = lVar15;
      lVar15 = lVar14 + 1;
    } while (hdc->maxcode[lVar14 + 10] <= uVar16 >> 0x10);
    iVar5 = j->code_bits;
    if (lVar15 == 8) {
LAB_001770e5:
      j->code_bits = iVar5 + -0x10;
      goto LAB_001770ee;
    }
    if (iVar5 < (int)(lVar14 + 10)) {
      stbi__g_failure_reason = "bad huffman code";
      return 0;
    }
    uVar8 = (uVar16 >> (0x17U - (char)lVar15 & 0x1f) & stbi__bmask[lVar14 + 10]) +
            hdc->delta[lVar14 + 10];
    if (0xff < uVar8) {
      stbi__g_failure_reason = "bad huffman code";
      return 0;
    }
    j->code_bits = (iVar5 - (int)lVar15) + -9;
    j->code_buffer = uVar16 << ((byte)(lVar14 + 10) & 0x1f);
    uVar6 = (ulong)uVar8;
  }
  else {
    bVar1 = hdc->size[uVar6];
    if (j->code_bits < (int)(uint)bVar1) {
LAB_001770ee:
      stbi__g_failure_reason = "bad huffman code";
      return 0;
    }
    j->code_buffer = uVar16 << (bVar1 & 0x1f);
    j->code_bits = j->code_bits - (uint)bVar1;
  }
  bVar1 = hdc->values[uVar6];
  if (0xf < bVar1) {
    stbi__g_failure_reason = "bad huffman code";
    return 0;
  }
  data[0x38] = 0;
  data[0x39] = 0;
  data[0x3a] = 0;
  data[0x3b] = 0;
  data[0x3c] = 0;
  data[0x3d] = 0;
  data[0x3e] = 0;
  data[0x3f] = 0;
  data[0x30] = 0;
  data[0x31] = 0;
  data[0x32] = 0;
  data[0x33] = 0;
  data[0x34] = 0;
  data[0x35] = 0;
  data[0x36] = 0;
  data[0x37] = 0;
  data[0x28] = 0;
  data[0x29] = 0;
  data[0x2a] = 0;
  data[0x2b] = 0;
  data[0x2c] = 0;
  data[0x2d] = 0;
  data[0x2e] = 0;
  data[0x2f] = 0;
  data[0x20] = 0;
  data[0x21] = 0;
  data[0x22] = 0;
  data[0x23] = 0;
  data[0x24] = 0;
  data[0x25] = 0;
  data[0x26] = 0;
  data[0x27] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x1e] = 0;
  data[0x1f] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[8] = 0;
  data[9] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0] = 0;
  data[1] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  data[6] = 0;
  data[7] = 0;
  uVar16 = 0;
  if (bVar1 != 0) {
    iVar5 = j->code_bits;
    if (iVar5 < (int)(uint)bVar1) {
      stbi__grow_buffer_unsafe(j);
      iVar5 = j->code_bits;
    }
    uVar16 = 0;
    if ((int)(uint)bVar1 <= iVar5) {
      uVar16 = j->code_buffer;
      uVar9 = uVar16 << (bVar1 & 0x1f) | uVar16 >> 0x20 - (bVar1 & 0x1f);
      uVar8 = stbi__bmask[bVar1];
      j->code_buffer = ~uVar8 & uVar9;
      j->code_bits = iVar5 - (uint)bVar1;
      iVar5 = 0;
      if (-1 < (int)uVar16) {
        iVar5 = stbi__jbias[bVar1];
      }
      uVar16 = iVar5 + (uVar9 & uVar8);
    }
  }
  uVar8 = j->img_comp[b].dc_pred;
  if (-1 < (int)(uVar8 ^ uVar16)) {
    bVar3 = (int)(uVar16 ^ 0x7fffffff) < (int)uVar8;
    if ((int)(uVar8 & uVar16) < 0) {
      bVar3 = (int)uVar8 < (int)(-0x80000000 - uVar16);
    }
    if (bVar3) {
      stbi__g_failure_reason = "bad delta";
      return 0;
    }
  }
  j->img_comp[b].dc_pred = uVar8 + uVar16;
  uVar2 = *dequant;
  uVar7 = (ushort)(uVar8 + uVar16);
  if (1 < (ushort)(uVar2 + 1)) {
    if ((short)(uVar2 ^ uVar7) < 0) {
      if ((short)uVar2 < 0) {
        if ((int)(short)uVar7 <= -0x8000 / (int)(short)uVar2) goto LAB_001771c5;
      }
      else if (-0x8000 / (int)(short)uVar2 <= (int)(short)uVar7) goto LAB_001771c5;
LAB_001771a1:
      stbi__g_failure_reason = "can\'t merge dc and ac";
      return 0;
    }
    if ((short)(0x7fff / (int)(short)uVar2) < (short)uVar7) goto LAB_001771a1;
  }
LAB_001771c5:
  *data = uVar2 * uVar7;
  iVar10 = j->code_bits;
  iVar11 = 1;
  do {
    if (iVar10 < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    uVar16 = j->code_buffer;
    uVar6 = (ulong)(uVar16 >> 0x17);
    uVar2 = fac[uVar6];
    if (uVar2 == 0) {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
        uVar16 = j->code_buffer;
        uVar6 = (ulong)(uVar16 >> 0x17);
      }
      uVar6 = (ulong)hac->fast[uVar6];
      if (uVar6 == 0xff) {
        lVar15 = 0;
        do {
          lVar14 = lVar15;
          lVar15 = lVar14 + 1;
        } while (hac->maxcode[lVar14 + 10] <= uVar16 >> 0x10);
        iVar5 = j->code_bits;
        if (lVar15 == 8) goto LAB_001770e5;
        if ((iVar5 < (int)(lVar14 + 10)) ||
           (uVar8 = (uVar16 >> (0x17U - (char)lVar15 & 0x1f) & stbi__bmask[lVar14 + 10]) +
                    hac->delta[lVar14 + 10], 0xff < uVar8)) goto LAB_001770ee;
        iVar10 = (iVar5 - (int)lVar15) + -9;
        j->code_bits = (iVar5 - (int)lVar15) + -9;
        j->code_buffer = uVar16 << ((byte)(lVar14 + 10) & 0x1f);
        uVar6 = (ulong)uVar8;
      }
      else {
        bVar1 = hac->size[uVar6];
        iVar10 = j->code_bits - (uint)bVar1;
        if (j->code_bits < (int)(uint)bVar1) goto LAB_001770ee;
        j->code_buffer = uVar16 << (bVar1 & 0x1f);
        j->code_bits = iVar10;
      }
      bVar1 = hac->values[uVar6];
      uVar16 = bVar1 & 0xf;
      if ((bVar1 & 0xf) == 0) {
        if (bVar1 != 0xf0) {
          return 1;
        }
        iVar11 = iVar11 + 0x10;
      }
      else {
        lVar15 = (long)iVar11 + (ulong)(bVar1 >> 4);
        bVar1 = ""[lVar15];
        if (iVar10 < (int)uVar16) {
          stbi__grow_buffer_unsafe(j);
          iVar10 = j->code_bits;
        }
        sVar4 = 0;
        sVar12 = 0;
        if ((int)uVar16 <= iVar10) {
          uVar8 = j->code_buffer;
          uVar13 = uVar8 << (sbyte)uVar16 | uVar8 >> 0x20 - (sbyte)uVar16;
          uVar9 = *(uint *)((long)stbi__bmask + (ulong)(uVar16 << 2));
          j->code_buffer = ~uVar9 & uVar13;
          j->code_bits = iVar10 - uVar16;
          if (-1 < (int)uVar8) {
            sVar4 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar16 << 2));
          }
          sVar12 = ((ushort)uVar13 & (ushort)uVar9) + sVar4;
          iVar10 = iVar10 - uVar16;
        }
        iVar11 = (int)lVar15 + 1;
        *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
             sVar12 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
      }
    }
    else {
      uVar8 = uVar2 & 0xf;
      iVar10 = j->code_bits - uVar8;
      if (j->code_bits < (int)uVar8) goto LAB_001770ee;
      lVar15 = (long)iVar11 + (ulong)(uVar2 >> 4 & 0xf);
      j->code_buffer = uVar16 << (sbyte)uVar8;
      j->code_bits = iVar10;
      iVar11 = (int)lVar15 + 1;
      *(short *)((long)data + (ulong)((uint)""[lVar15] * 2)) =
           (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar15] * 2));
    }
    if (0x3f < iVar11) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}